

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O2

void __thiscall ON_ErrorLog::Dump(ON_ErrorLog *this,ON_TextLog *text_log)

{
  ON_ErrorEvent *this_00;
  ulong uVar1;
  bool bVar2;
  ON_TextLogIndent indent1;
  
  uVar1 = 0x20;
  if (this->m_event_count < 0x20) {
    uVar1 = (ulong)this->m_event_count;
  }
  ON_TextLog::Print(text_log,"Error log: %u events\n",uVar1);
  ON_TextLogIndent::ON_TextLogIndent(&indent1,text_log);
  this_00 = this->m_events;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    ON_ErrorEvent::Dump(this_00,text_log);
    this_00 = this_00 + 1;
  }
  ON_TextLogIndent::~ON_TextLogIndent(&indent1);
  return;
}

Assistant:

void ON_ErrorLog::Dump(
  class ON_TextLog& text_log
) const
{
  const unsigned int count = Count();
  text_log.Print("Error log: %u events\n", count);
  ON_TextLogIndent indent1(text_log);
  for (unsigned int i = 0; i < count; i++)
  {
    m_events[i].Dump(text_log);
  }
}